

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_db_class.cpp
# Opt level: O1

void __thiscall test_cpp_db::test_conversions_ui16::test_method(test_conversions_ui16 *this)

{
  double dVar1;
  char cVar2;
  uchar uVar3;
  short sVar4;
  unsigned_short uVar5;
  int iVar6;
  uint uVar7;
  value *val_00;
  longdouble in_ST0;
  float fVar8;
  uint8_t vui8;
  int8_t vi8;
  unsigned_long local_130;
  unsigned_long *local_128;
  undefined1 local_120 [16];
  undefined1 *local_110;
  char *local_108;
  assertion_result local_100;
  uint64_t **local_e8;
  value val;
  uint64_t *local_d0;
  lazy_ostream local_c8;
  undefined1 *local_b8;
  lazy_ostream *local_b0;
  assertion_result local_a8;
  uint16_t vui16;
  int16_t vi16;
  const_string local_88;
  uint32_t vui32;
  int32_t vi32;
  uint64_t vui64;
  int64_t vi64;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  val._M_manager = std::any::_Manager_internal<unsigned_short>::_S_manage;
  val._M_storage._M_ptr = (void *)0xd903;
  vi8 = '\x03';
  vui8 = '\x03';
  vi16 = -0x26fd;
  vui16 = 0xd903;
  vi32 = 0xd903;
  vui32 = 0xd903;
  vi64 = 0xd903;
  vui64 = 0xd903;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb3;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  cVar2 = cpp_db::numeric_extractor<signed_char>(&val);
  local_128 = &local_130;
  local_d0 = (uint64_t *)&vi8;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(cVar2 == vi8);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_b0 = (lazy_ostream *)&local_128;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001978a8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_001978a8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  local_130._0_1_ = cVar2;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb3,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int8_t>(val)",&local_c8,"vi8",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb4;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  uVar3 = cpp_db::numeric_extractor<unsigned_char>(&val);
  local_130 = CONCAT71(local_130._1_7_,uVar3);
  local_d0 = (uint64_t *)&vui8;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar3 == vui8);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001978e8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_001978e8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb4,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<uint8_t>(val)",&local_c8,"vui8",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb5;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  sVar4 = cpp_db::numeric_extractor<short>(&val);
  local_d0 = (uint64_t *)&vi16;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(sVar4 == vi16);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197928;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_00197928;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  local_130._0_2_ = sVar4;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb5,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int16_t>(val)",&local_c8,"vi16",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb6;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  uVar5 = cpp_db::numeric_extractor<unsigned_short>(&val);
  local_130 = CONCAT62(local_130._2_6_,uVar5);
  local_d0 = (uint64_t *)&vui16;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar5 == vui16);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197968;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_00197968;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb6,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<uint16_t>(val)",&local_c8,"vui16",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb7;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  iVar6 = cpp_db::numeric_extractor<int>(&val);
  local_d0 = (uint64_t *)&vi32;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar6 == vi32);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001979a8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_001979a8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  local_130._0_4_ = iVar6;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb7,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int32_t>(val)",&local_c8,"vi32",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb8;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  uVar7 = cpp_db::numeric_extractor<unsigned_int>(&val);
  local_130 = CONCAT44(local_130._4_4_,uVar7);
  local_d0 = (uint64_t *)&vui32;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(uVar7 == vui32);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001979e8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_001979e8;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb8,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<uint32_t>(val)",&local_c8,"vui32",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xb9;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_130 = cpp_db::numeric_extractor<long>(&val);
  local_d0 = (uint64_t *)&vi64;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_130 == vi64);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197a28;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_00197a28;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xb9,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<int64_t>(val)",&local_c8,"vi64",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xba;
  local_120._8_8_ = local_120._8_8_ & 0xffffffffffffff00;
  local_120._0_8_ = &PTR__lazy_ostream_001976e8;
  local_110 = boost::unit_test::lazy_ostream::inst;
  local_108 = "";
  local_130 = cpp_db::numeric_extractor<unsigned_long>(&val);
  local_d0 = &vui64;
  local_a8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_130 == vui64);
  local_a8.m_message.px = (element_type *)0x0;
  local_a8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_88.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_88.m_end = "";
  local_128 = &local_130;
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197a68;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_128;
  local_100.m_message.px = (element_type *)((ulong)local_100.m_message.px & 0xffffffffffffff00);
  local_100._0_8_ = &PTR__lazy_ostream_00197a68;
  local_100.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_e8 = &local_d0;
  boost::test_tools::tt_detail::report_assertion
            (&local_a8,(lazy_ostream *)local_120,&local_88,0xba,CHECK,CHECK_EQUAL,2,
             "cpp_db::value_of<uint64_t>(val)",&local_c8,"vui64",&local_100);
  boost::detail::shared_count::~shared_count(&local_a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbb;
  fVar8 = cpp_db::numeric_extractor<float>(&val);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120._0_8_ = "std::fabs(cpp_db::value_of<float>(val) - vf) < 1e-6";
  local_120._8_8_ = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197628;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_40.m_end = "";
  local_b0 = (lazy_ostream *)local_120;
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(ABS(fVar8 + -55555.0) < 1e-06);
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_c8,&local_40,0xbb,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbc;
  dVar1 = cpp_db::numeric_extractor<double>(&val);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(ABS(dVar1 + -55555.0) < 1e-06);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120._0_8_ = "std::fabs(cpp_db::value_of<double>(val) - vd) < 1e-6";
  local_120._8_8_ = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197628;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_50.m_end = "";
  local_b0 = (lazy_ostream *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_c8,&local_50,0xbc,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  val_00 = (value *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xbd;
  cpp_db::numeric_extractor<long_double>((longdouble *)&val,val_00);
  local_100.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(ABS(in_ST0 + (longdouble)-55555.0) < (longdouble)1e-06);
  local_100.m_message.px = (element_type *)0x0;
  local_100.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_120._0_8_ = "std::fabs(cpp_db::value_of<long double>(val) - vld) < 1e-6";
  local_120._8_8_ = "";
  local_c8.m_empty = false;
  local_c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_00197628;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_cpp_db_class.cpp"
  ;
  local_60.m_end = "";
  local_b0 = (lazy_ostream *)local_120;
  boost::test_tools::tt_detail::report_assertion
            (&local_100,&local_c8,&local_60,0xbd,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&local_100.m_message.pn);
  if (val._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*val._M_manager)(_Op_destroy,&val,(_Arg *)0x0);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_conversions_i32)
{
    cpp_db::value val{int32_t{1111111111}};
    int8_t vi8{-57};
    uint8_t vui8{199};
    int16_t vi16{13767};
    uint16_t vui16{13767};
    int32_t vi32{1111111111};
    uint32_t vui32{1111111111};
    int64_t vi64{1111111111};
    uint64_t vui64{1111111111};
    float vf{1111111111.0f};
    double vd{1111111111.0};
    long double vld{1111111111.0l};

    BOOST_CHECK_EQUAL(cpp_db::value_of<int8_t>(val), vi8);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint8_t>(val), vui8);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int16_t>(val), vi16);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint16_t>(val), vui16);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int32_t>(val), vi32);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint32_t>(val), vui32);
    BOOST_CHECK_EQUAL(cpp_db::value_of<int64_t>(val), vi64);
    BOOST_CHECK_EQUAL(cpp_db::value_of<uint64_t>(val), vui64);
    BOOST_CHECK(std::fabs(cpp_db::value_of<float>(val) - vf) < 1e-6);
    BOOST_CHECK(std::fabs(cpp_db::value_of<double>(val) - vd) < 1e-6);
    BOOST_CHECK(std::fabs(cpp_db::value_of<long double>(val) - vld) < 1e-6);
}